

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

size_t fiobj_str_is_eq(FIOBJ self,FIOBJ other)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  void *__s1;
  size_t __n;
  ulong uVar4;
  void *__s2;
  
  uVar3 = self & 0xfffffffffffffff8;
  uVar4 = other & 0xfffffffffffffff8;
  sVar2 = 1;
  if (uVar3 != uVar4) {
    if ((*(byte *)(uVar3 + 0x10) == 0) && (__s1 = *(void **)(uVar3 + 0x38), __s1 != (void *)0x0)) {
      __n = *(size_t *)(uVar3 + 0x28);
    }
    else {
      __n = (size_t)(*(byte *)(uVar3 + 0x10) >> 1);
      __s1 = (void *)(uVar3 + 0x12);
    }
    if ((*(byte *)(uVar4 + 0x10) == 0) && (__s2 = *(void **)(uVar4 + 0x38), __s2 != (void *)0x0)) {
      uVar3 = *(ulong *)(uVar4 + 0x28);
    }
    else {
      uVar3 = (ulong)(*(byte *)(uVar4 + 0x10) >> 1);
      __s2 = (void *)(uVar4 + 0x12);
    }
    if (__n != uVar3) {
      return 0;
    }
    iVar1 = bcmp(__s1,__s2,__n);
    sVar2 = (size_t)(iVar1 == 0);
  }
  return sVar2;
}

Assistant:

static size_t fiobj_str_is_eq(const FIOBJ self, const FIOBJ other) {
  return fio_str_iseq(&obj2str(self)->str, &obj2str(other)->str);
}